

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<async_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  callable_impl<void,_async_test::binder> *this_00;
  binder *in_RSI;
  binder *in_RDI;
  binder *in_stack_ffffffffffffff88;
  undefined1 add_ref;
  
  this_00 = (callable_impl<void,_async_test::binder> *)operator_new(0x38);
  async_test::binder::binder(in_RDI,in_stack_ffffffffffffff88);
  add_ref = (undefined1)((ulong)in_RDI >> 0x38);
  callable_impl<void,_async_test::binder>::callable_impl(this_00,in_RSI);
  intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_> *)
             this_00,(callable<void_(cppcms::http::context::completion_type)> *)in_RSI,(bool)add_ref
            );
  async_test::binder::~binder((binder *)0x10ebe0);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}